

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PollerSelect.cpp
# Opt level: O2

void __thiscall
Liby::PollerSelect::updateChanel(PollerSelect *this,Channel *ch,bool readable,bool writable)

{
  __fd_mask *p_Var1;
  uint uVar2;
  ulong uVar3;
  
  if (ch != (Channel *)0x0) {
    uVar2 = ch->fd_;
    if (-1 < (int)uVar2) {
      uVar3 = 1L << ((byte)uVar2 & 0x3f);
      if (readable) {
        p_Var1 = (this->rset_).fds_bits + (uVar2 >> 6);
        *p_Var1 = *p_Var1 | uVar3;
      }
      else {
        p_Var1 = (this->rset_).fds_bits + (uVar2 >> 6);
        *p_Var1 = *p_Var1 & ~uVar3;
      }
      uVar3 = 1L << ((byte)uVar2 & 0x3f);
      if (writable) {
        p_Var1 = (this->wset_).fds_bits + (uVar2 >> 6);
        *p_Var1 = *p_Var1 | uVar3;
        return;
      }
      p_Var1 = (this->wset_).fds_bits + (uVar2 >> 6);
      *p_Var1 = *p_Var1 & ~uVar3;
      return;
    }
  }
  __assert_fail("ch && ch->get_fd() >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/PollerSelect.cpp"
                ,0x1e,"virtual void Liby::PollerSelect::updateChanel(Channel *, bool, bool)");
}

Assistant:

void PollerSelect::updateChanel(Channel *ch, bool readable, bool writable) {
    assert(ch && ch->get_fd() >= 0);

    int fd = ch->get_fd();

    if (readable) {
        FD_SET(fd, &rset_);
    } else {
        FD_CLR(fd, &rset_);
    }

    if (writable) {
        FD_SET(fd, &wset_);
    } else {
        FD_CLR(fd, &wset_);
    }
}